

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h262_slice.c
# Opt level: O0

int h262_mb_addr_inc(bitstream *str,uint32_t *val)

{
  int iVar1;
  uint *in_RSI;
  int *in_RDI;
  uint32_t tmp_1;
  uint32_t c33;
  uint32_t tmp;
  vs_vlc_val *in_stack_00000078;
  uint32_t *in_stack_00000080;
  bitstream *in_stack_00000088;
  int local_24;
  uint local_1c;
  
  if (*in_RDI == 0) {
    for (local_1c = *in_RSI; 0x20 < local_1c; local_1c = local_1c - 0x21) {
      iVar1 = vs_vlc(in_stack_00000088,in_stack_00000080,in_stack_00000078);
      if (iVar1 != 0) {
        return 1;
      }
    }
    iVar1 = vs_vlc(in_stack_00000088,in_stack_00000080,in_stack_00000078);
    if (iVar1 != 0) {
      return 1;
    }
  }
  else {
    *in_RSI = 0;
    do {
      while( true ) {
        iVar1 = vs_vlc(in_stack_00000088,in_stack_00000080,in_stack_00000078);
        if (iVar1 != 0) {
          return 1;
        }
        if (local_24 != 0x21) break;
        *in_RSI = *in_RSI + 0x21;
      }
    } while (local_24 == 0x22);
    *in_RSI = local_24 + *in_RSI;
  }
  return 0;
}

Assistant:

int h262_mb_addr_inc(struct bitstream *str, uint32_t *val) {
	if (str->dir == VS_ENCODE) {
		uint32_t tmp = *val, c33 = 33;
		while (tmp > 32) {
			if (vs_vlc(str, &c33, mbai_vlc)) return 1;
			tmp -= 33;
		}
		if (vs_vlc(str, &tmp, mbai_vlc)) return 1;
	} else {
		*val = 0;
		uint32_t tmp;
		while (1) {
			if (vs_vlc(str, &tmp, mbai_vlc)) return 1;
			if (tmp == 33) {
				*val += 33;
			} else if (tmp == 34) {
				/* stuffing */
			} else {
				*val += tmp;
				break;
			}
		}
	}
	return 0;
}